

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O3

bool __thiscall indk::NeuralNet::isLearned(NeuralNet *this)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var2 = (this->Neurons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->Neurons)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    bVar1 = true;
  }
  else {
    do {
      bVar1 = Neuron::isLearned(*(Neuron **)(p_Var2 + 2));
      if (!bVar1) {
        return bVar1;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return bVar1;
}

Assistant:

bool indk::NeuralNet::isLearned() {
    for (const auto& N: Neurons) {
        if (!N.second -> isLearned()) return false;
    }
    return true;
}